

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
          (SmallVectorBase<slang::parsing::Token> *this,Token *args)

{
  undefined8 uVar1;
  iterator pTVar2;
  undefined8 *in_RSI;
  SmallVectorBase<slang::parsing::Token> *in_RDI;
  Token *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::parsing::Token> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::parsing::Token>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pTVar2 = end(in_RDI);
    uVar1 = *in_RSI;
    pTVar2->kind = (short)uVar1;
    pTVar2->field_0x2 = (char)((ulong)uVar1 >> 0x10);
    pTVar2->numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    pTVar2->rawLen = (int)((ulong)uVar1 >> 0x20);
    pTVar2->info = (Info *)in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }